

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mocks.c
# Opt level: O0

CgreenVector * constraints_vector_from_va_list(__va_list_tag *constraints)

{
  uint uVar1;
  CgreenVector *pCVar2;
  CgreenVector *vector_00;
  uint *in_RDI;
  Constraint *constraint;
  CgreenVector *vector;
  void *in_stack_ffffffffffffffc8;
  
  pCVar2 = create_constraints_vector();
  while( true ) {
    uVar1 = *in_RDI;
    if (uVar1 < 0x29) {
      vector_00 = (CgreenVector *)((long)(int)uVar1 + *(long *)(in_RDI + 4));
      *in_RDI = uVar1 + 8;
    }
    else {
      vector_00 = *(CgreenVector **)(in_RDI + 2);
      *(_func_void_void_ptr ***)(in_RDI + 2) = &vector_00->destructor;
    }
    if (*(long *)vector_00 == 0) break;
    cgreen_vector_add(vector_00,in_stack_ffffffffffffffc8);
  }
  return pCVar2;
}

Assistant:

static CgreenVector *constraints_vector_from_va_list(va_list constraints) {
    CgreenVector *vector = create_constraints_vector();
    Constraint *constraint;
    while ((constraint = va_arg(constraints, Constraint *)) != (Constraint *)0) {
        cgreen_vector_add(vector, constraint);
    }
    return vector;
}